

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void rw::ps2::objUninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  Geometry *this;
  InstanceDataHeader *pIVar2;
  uint32 uVar3;
  uint32 *__s;
  ulong uVar4;
  uint8 *puVar5;
  int32 extraout_EDX;
  long lVar6;
  MatPipeline *pMVar7;
  int32 iVar8;
  int8 *adc;
  Mesh *m;
  uint32 i_1;
  long lVar9;
  uint32 i;
  ulong uVar10;
  uint8 *data [10];
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    pIVar2 = this->instData;
    this->numVertices = this->meshHeader->totalIndices;
    uVar3 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar3;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 879"
    ;
    __s = (uint32 *)(*DAT_00145dd8)((long)this->numVertices << 2);
    memset(__s,0,(long)this->numVertices << 2);
    memset(*(void **)(this->meshHeader + 1),0,(ulong)(this->meshHeader->totalIndices * 2));
    lVar6 = 0x20;
    for (uVar10 = 0; uVar4 = (ulong)pIVar2[1].platform, uVar10 < uVar4; uVar10 = uVar10 + 1) {
      pMVar7 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = *(MatPipeline **)(*(long *)((long)&this->meshHeader->flags + lVar6) + 0x18);
      }
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = defaultMatPipe;
      }
      if (pMVar7->preUninstCB != (_func_void_MatPipeline_ptr_Geometry_ptr *)0x0) {
        (*pMVar7->preUninstCB)(pMVar7,this);
      }
      lVar6 = lVar6 + 0x18;
    }
    this->numVertices = 0;
    lVar6 = 0x10;
    lVar9 = 0;
    for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
      pMVar7 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = *(MatPipeline **)(*(long *)((long)&this->meshHeader[1].flags + lVar6) + 0x18);
      }
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = defaultMatPipe;
      }
      m = (Mesh *)((long)&this->meshHeader->flags + lVar6);
      data[8] = (uint8 *)0x0;
      data[9] = (uint8 *)0x0;
      data[6] = (uint8 *)0x0;
      data[7] = (uint8 *)0x0;
      data[4] = (uint8 *)0x0;
      data[5] = (uint8 *)0x0;
      data[2] = (uint8 *)0x0;
      data[3] = (uint8 *)0x0;
      data[0] = (uint8 *)0x0;
      data[1] = (uint8 *)0x0;
      puVar5 = MatPipeline::collectData
                         (pMVar7,this,(InstanceData *)(*(long *)(pIVar2 + 2) + lVar9),m,data);
      (*pMVar7->uninstanceCB)(pMVar7,this,__s,m,data);
      (*DAT_00145dd0)(puVar5);
      uVar4 = (ulong)pIVar2[1].platform;
      lVar6 = lVar6 + 0x18;
      lVar9 = lVar9 + 0x20;
    }
    lVar6 = 0x20;
    for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
      pMVar7 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = *(MatPipeline **)(*(long *)((long)&this->meshHeader->flags + lVar6) + 0x18);
      }
      if (pMVar7 == (MatPipeline *)0x0) {
        pMVar7 = defaultMatPipe;
      }
      if (pMVar7->postUninstCB != (_func_void_MatPipeline_ptr_Geometry_ptr *)0x0) {
        (*pMVar7->postUninstCB)(pMVar7,this);
        uVar4 = (ulong)pIVar2[1].platform;
      }
      lVar6 = lVar6 + 0x18;
    }
    lVar6 = (long)adcOffset;
    if ((lVar6 == 0) || (*(int *)((long)this->texCoords + lVar6 + -0x38) == 0)) {
      adc = (int8 *)0x0;
    }
    else {
      adc = *(int8 **)((long)this->texCoords + lVar6 + -0x30);
    }
    Geometry::generateTriangles(this,adc);
    iVar8 = (int32)adc;
    (*DAT_00145dd0)(__s);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    destroyNativeData(this,iVar8,extraout_EDX);
  }
  return;
}

Assistant:

static void
objUninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	// highest possible number of vertices
	geo->numVertices = geo->meshHeader->totalIndices;
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);
	uint32 *flags = rwNewT(uint32, geo->numVertices,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	memset(flags, 0, 4*geo->numVertices);
	memset(geo->meshHeader->getMeshes()->indices, 0, 2*geo->meshHeader->totalIndices);
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->preUninstCB) m->preUninstCB(m, geo);
	}
	geo->numVertices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		InstanceData *instance = &header->instanceMeshes[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;

		//printDMAVIF(instance);
		uint8 *data[nelem(m->attribs)] = { nil };
		uint8 *raw = m->collectData(geo, instance, mesh, data);
		assert(m->uninstanceCB);
		m->uninstanceCB(m, geo, flags, mesh, data);
		rwFree(raw);
	}
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->postUninstCB) m->postUninstCB(m, geo);
	}

	int8 *bits = getADCbits(geo);
	geo->generateTriangles(bits);
	rwFree(flags);
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
/*
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->mesh[i];
		InstanceData *instance = &header->instanceMeshes[i];
//		printf("numIndices: %d\n", mesh->numIndices);
//		printDMA(instance);
		printVertCounts(instance, geo->meshHeader->flags);
	}
*/
}